

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::FunctionOptimizer::create(FunctionOptimizer *this)

{
  PCVStructValuesMap *propagatedInfos;
  SubTypes *subTypes;
  PCVStructValuesMap *rawNewInfos;
  FunctionOptimizer *this_00;
  long in_RSI;
  
  propagatedInfos = *(PCVStructValuesMap **)(in_RSI + 0x130);
  subTypes = *(SubTypes **)(in_RSI + 0x138);
  rawNewInfos = *(PCVStructValuesMap **)(in_RSI + 0x140);
  this_00 = (FunctionOptimizer *)operator_new(0x150);
  FunctionOptimizer(this_00,propagatedInfos,subTypes,rawNewInfos,*(bool *)(in_RSI + 0x148));
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionOptimizer>(
      propagatedInfos, subTypes, rawNewInfos, refTest);
  }